

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartComment(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  undefined8 *data;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterStartComment : invalid writer!\n");
    return -1;
  }
  lk._0_4_ = 0;
  lk_00 = xmlListFront(writer->nodes);
  if (((lk_00 != (xmlLinkPtr)0x0) && (pvVar3 = xmlLinkGetData(lk_00), pvVar3 != (void *)0x0)) &&
     (iVar2 = *(int *)((long)pvVar3 + 8), iVar2 != 0)) {
    if (iVar2 == 1) {
      iVar2 = xmlTextWriterOutputNSDecl(writer);
      if (iVar2 < 0) {
        return -1;
      }
      iVar1 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar1 < 0) {
        return -1;
      }
      lk._0_4_ = iVar1 + iVar2;
      if (writer->indent != 0) {
        iVar2 = xmlOutputBufferWriteString(writer->out,"\n");
        if (iVar2 < 0) {
          return -1;
        }
        lk._0_4_ = iVar2 + (int)lk;
      }
      *(undefined4 *)((long)pvVar3 + 8) = 3;
    }
    else if (iVar2 != 3) {
      return -1;
    }
  }
  data = (undefined8 *)(*xmlMalloc)(0x10);
  if (data == (undefined8 *)0x0) {
    xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
    writer_local._4_4_ = -1;
  }
  else {
    *data = 0;
    *(undefined4 *)(data + 1) = 0x10;
    xmlListPushFront(writer->nodes,data);
    if (writer->indent != 0) {
      iVar2 = xmlTextWriterWriteIndent(writer);
      if (iVar2 < 0) {
        return -1;
      }
      lk._0_4_ = iVar2 + (int)lk;
    }
    iVar2 = xmlOutputBufferWriteString(writer->out,"<!--");
    if (iVar2 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = iVar2 + (int)lk;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartComment(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartComment : invalid writer!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_NONE:
                    break;
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    if (writer->indent) {
                        count =
                            xmlOutputBufferWriteString(writer->out, "\n");
                        if (count < 0)
                            return -1;
                        sum += count;
                    }
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        return -1;
    }

    p->name = NULL;
    p->state = XML_TEXTWRITER_COMMENT;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!--");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}